

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

void __thiscall
gl4cts::CopyImage::NonExistentMipMapTest::NonExistentMipMapTest
          (NonExistentMipMapTest *this,Context *context)

{
  vector<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
  *this_00;
  long lVar1;
  testCase test_case;
  undefined1 local_48 [4];
  undefined8 local_44;
  GLenum local_3c;
  NonExistentMipMapTest *local_38;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"non_existent_mipmap",
             "Test verifies if INVALID_VALUE is generated when CopySubImageData is executed for mipmap that does not exist"
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__NonExistentMipMapTest_01dbcdc8;
  this->m_dst_tex_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  this_00 = &this->m_test_cases;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = this;
  for (lVar1 = 0; lVar1 != 0x2c; lVar1 = lVar1 + 4) {
    local_48 = *(undefined1 (*) [4])((long)&s_valid_targets + lVar1);
    local_44._0_4_ = 0;
    local_44._4_4_ = 0;
    local_3c = 0;
    if (lVar1 != 0) {
      std::
      vector<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
      ::push_back(this_00,(value_type *)local_48);
      local_3c = 0x501;
      local_44._0_4_ = 0;
      local_44._4_4_ = 1;
      std::
      vector<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
      ::push_back(this_00,(value_type *)local_48);
      local_44._0_4_ = 1;
      local_44._4_4_ = 0;
      std::
      vector<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
      ::push_back(this_00,(value_type *)local_48);
      local_44 = &DAT_100000001;
      std::
      vector<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
      ::push_back(this_00,(value_type *)local_48);
    }
  }
  return;
}

Assistant:

NonExistentMipMapTest::NonExistentMipMapTest(deqp::Context& context)
	: TestCase(context, "non_existent_mipmap", "Test verifies if INVALID_VALUE is generated when CopySubImageData is "
											   "executed for mipmap that does not exist")
	, m_dst_tex_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	for (GLuint target = 0; target < s_n_valid_targets; ++target)
	{
		const GLenum tex_target = s_valid_targets[target];
		testCase	 test_case  = { tex_target, 0, 0, GL_NO_ERROR };

		if (GL_RENDERBUFFER == tex_target)
		{
			continue;
		}

		m_test_cases.push_back(test_case);

		/* Rest of cases is invalid */
		test_case.m_expected_result = GL_INVALID_VALUE;

		test_case.m_dst_level = 1;
		test_case.m_src_level = 0;
		m_test_cases.push_back(test_case);

		test_case.m_dst_level = 0;
		test_case.m_src_level = 1;
		m_test_cases.push_back(test_case);

		test_case.m_dst_level = 1;
		test_case.m_src_level = 1;
		m_test_cases.push_back(test_case);
	}
}